

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O3

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmResourceInfoCommon::GetUnifiedAuxSurfaceOffset
          (GmmResourceInfoCommon *this,GMM_UNIFIED_AUX_TYPE GmmAuxType)

{
  anon_struct_8_45_9b07292e_for_Gpu aVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte *pbVar4;
  undefined4 extraout_var_01;
  GMM_GFX_SIZE_T GVar5;
  GMM_GFX_SIZE_T GVar6;
  
  (*this->pClientContext->_vptr_GmmClientContext[0x10])();
  aVar1 = (this->Surf).Flags.Gpu;
  uVar2 = aVar1._0_4_;
  if (((ulong)aVar1 >> 0x25 & 1) == 0) {
    if ((~uVar2 & 0x1400) == 0 && GmmAuxType == GMM_AUX_CC) {
      GVar6 = (this->Surf).Size - 8;
      goto LAB_0019e540;
    }
    if ((uVar2 & 6) == 4 && GmmAuxType == GMM_AUX_CC) {
      GVar6 = (this->Surf).Size;
      goto LAB_0019e540;
    }
    goto switchD_0019e430_default;
  }
  switch(GmmAuxType) {
  case GMM_AUX_CCS:
  case GMM_AUX_Y_CCS:
  case GMM_AUX_HIZ:
  case GMM_AUX_MCS:
  case GMM_AUX_SURF:
    GVar6 = (this->Surf).Size;
    if ((((((ulong)aVar1 & 2) != 0) && (GmmAuxType == GMM_AUX_CCS)) &&
        ((this->AuxSecSurf).Type != RESOURCE_INVALID)) &&
       ((((ulong)aVar1 & 0x40) != 0 || (1 < (this->Surf).MSAA.NumSamples)))) {
      GVar6 = GVar6 + (this->AuxSurf).Size;
    }
    break;
  case GMM_AUX_UV_CCS:
    GVar5 = (this->Surf).Size;
    if ((((ulong)aVar1 & 2) == 0) || (((this->AuxSurf).Flags.Gpu.field_0x5 & 8) == 0)) {
      GVar6 = (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[6] *
              (this->AuxSurf).Pitch + GVar5;
      if (((uVar2 >> 0x10 & 1) == 0) || (((this->AuxSurf).Flags.Gpu.field_0x5 & 8) == 0)) break;
      GVar6 = (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[1];
    }
    else {
      GVar6 = (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[2];
    }
    GVar6 = GVar5 + GVar6;
    break;
  case GMM_AUX_CC:
    if (((ulong)aVar1 & 0x1004) != 0) {
      GVar6 = (this->AuxSurf).UnpaddedSize + (this->Surf).Size;
      iVar3 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
      if ((*(byte *)(CONCAT44(extraout_var,iVar3) + 0x20) & 4) != 0) {
        iVar3 = (*this->_vptr_GmmResourceInfoCommon[0x1b])(this);
        pbVar4 = (byte *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x178))
                                   ((long *)CONCAT44(extraout_var_00,iVar3));
        GVar5 = GVar6;
        if (1 < (this->Surf).MSAA.NumSamples) {
          GVar5 = (this->Surf).Size;
        }
        if ((*pbVar4 & 1) == 0) {
          GVar6 = GVar5;
        }
      }
      break;
    }
  default:
switchD_0019e430_default:
    GVar6 = 0;
    break;
  case GMM_AUX_COMP_STATE:
    GVar6 = (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[1] + (this->Surf).Size +
            (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Offset[2];
    break;
  case GMM_AUX_ZCS:
    GVar6 = 0;
    if (((~uVar2 & 0x42) == 0) && ((this->AuxSecSurf).Type != RESOURCE_INVALID)) {
      GVar6 = (this->AuxSurf).Size + (this->Surf).Size;
    }
  }
LAB_0019e540:
  iVar3 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
  if ((((*(byte *)(CONCAT44(extraout_var_01,iVar3) + 0x1f) & 2) != 0) &&
      (((this->Surf).Flags.Gpu.field_0x2 & 0x20) == 0)) &&
     ((GmmAuxType - GMM_AUX_CCS < 8 && ((0x87U >> (GmmAuxType - GMM_AUX_CCS & 0x1f) & 1) != 0)))) {
    GVar6 = 0;
  }
  return GVar6;
}

Assistant:

GMM_INLINE_VIRTUAL GMM_INLINE_EXPORTED GMM_GFX_SIZE_T GMM_STDCALL GetUnifiedAuxSurfaceOffset(GMM_UNIFIED_AUX_TYPE GmmAuxType)
            {
                GMM_GFX_SIZE_T Offset = 0;
		const GMM_PLATFORM_INFO *pPlatform;
		pPlatform = (GMM_PLATFORM_INFO *)GMM_OVERRIDE_EXPORTED_PLATFORM_INFO(&Surf, GetGmmLibContext());
		GMM_UNREFERENCED_PARAMETER(pPlatform);

                if (Surf.Flags.Gpu.UnifiedAuxSurface)
                {
                    if ((GmmAuxType == GMM_AUX_CCS) || (GmmAuxType == GMM_AUX_SURF) || (GmmAuxType == GMM_AUX_Y_CCS)
                        || (GmmAuxType == GMM_AUX_HIZ) || (GmmAuxType == GMM_AUX_MCS))
                    {
                        Offset = Surf.Size;
                        if (GmmAuxType == GMM_AUX_CCS && AuxSecSurf.Type != RESOURCE_INVALID
                            && (Surf.Flags.Gpu.CCS && (Surf.MSAA.NumSamples > 1 ||
                                Surf.Flags.Gpu.Depth)))
                        {
                            Offset += AuxSurf.Size;
                        }
                    }
                    else if (GmmAuxType == GMM_AUX_UV_CCS)
                    {
                        Offset = Surf.Size + (AuxSurf.Pitch * AuxSurf.OffsetInfo.Plane.Y[GMM_PLANE_U]); //Aux Offset in HwLayout

                        if (Surf.Flags.Gpu.CCS && AuxSurf.Flags.Gpu.__NonMsaaLinearCCS)
                        {
                            Offset = Surf.Size + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_U];
                        }
                        else if (Surf.Flags.Gpu.MMC && AuxSurf.Flags.Gpu.__NonMsaaLinearCCS )
                        {
                            Offset = Surf.Size + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_Y];
                        }
                    }
                    else if ((GmmAuxType == GMM_AUX_CC) && (Surf.Flags.Gpu.IndirectClearColor || Surf.Flags.Gpu.ColorDiscard))
                    {
                        Offset = Surf.Size + AuxSurf.UnpaddedSize;
			
			if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression
#ifndef __GMM_KMD__
                        && !(((GMM_AIL_STRUCT *)(GetGmmClientContext()->GmmGetAIL()))->AilDisableXe2CompressionRequest)
#endif
			)
			{
	                    if (Surf.MSAA.NumSamples > 1)
	                    {
	                        Offset = Surf.Size; // Beginning of MCS which is first 4K of AuxSurf, Clear colour is stored only for MSAA surfaces
	                    }
	                }
                    }
                    else if (GmmAuxType == GMM_AUX_COMP_STATE)
                    {
                        Offset = Surf.Size + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_Y] + AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_U];
                    }
                    else if ((GmmAuxType == GMM_AUX_ZCS) && Surf.Flags.Gpu.Depth && Surf.Flags.Gpu.CCS)
                    {
                        if (AuxSecSurf.Type != RESOURCE_INVALID)
                        {
                            Offset = Surf.Size + AuxSurf.Size;
                        }
                    }
                }
                else if(GmmAuxType == GMM_AUX_CC &&
                        Surf.Flags.Gpu.IndirectClearColor &&
                        Surf.Flags.Gpu.HiZ)
                {
                    Offset = Surf.Size - GMM_HIZ_CLEAR_COLOR_SIZE;
                }
                else if (GmmAuxType == GMM_AUX_CC &&
                    Surf.Flags.Gpu.ColorDiscard &&
                    !Surf.Flags.Gpu.CCS)
                {
                    Offset = Surf.Size;
                }
                else
                {
                    Offset = 0;
                }

                if((GetGmmLibContext()->GetSkuTable().FtrFlatPhysCCS) && !Surf.Flags.Gpu.ProceduralTexture &&
                    (GmmAuxType == GMM_AUX_CCS || GmmAuxType == GMM_AUX_ZCS ||
                    GmmAuxType == GMM_AUX_Y_CCS || GmmAuxType == GMM_AUX_UV_CCS))
                {
                    Offset = 0;
                }

                return Offset;
            }